

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O0

void __thiscall
tchecker::details::
rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::compile_clock_predicate
          (rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,typed_expression_t *clock1,typed_expression_t *clock2,
          shared_ptr<const_tchecker::typed_expression_t> *bound,instruction_t instruction)

{
  expression_type_t eVar1;
  element_type *peVar2;
  invalid_argument *this_00;
  value_type_conflict2 local_78 [3];
  undefined1 local_60 [8];
  typed_unary_expression_t neg_bound;
  instruction_t instruction_local;
  shared_ptr<const_tchecker::typed_expression_t> *bound_local;
  typed_expression_t *clock2_local;
  typed_expression_t *clock1_local;
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  *this_local;
  
  neg_bound.super_unary_expression_t._expr.
  super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = instruction;
  peVar2 = std::
           __shared_ptr_access<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)bound);
  eVar1 = typed_expression_t::type(peVar2);
  eVar1 = type_neg(eVar1);
  typed_unary_expression_t::typed_unary_expression_t
            ((typed_unary_expression_t *)local_60,eVar1,EXPR_OP_NEG,bound);
  if (neg_bound.super_unary_expression_t._expr.
      super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ._4_4_ == VM_LT) {
    peVar2 = std::
             __shared_ptr_access<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)bound);
    compile_clock_constraint(this,clock1,clock2,LT,peVar2);
  }
  else if (neg_bound.super_unary_expression_t._expr.
           super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi._4_4_ == VM_LE) {
    peVar2 = std::
             __shared_ptr_access<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)bound);
    compile_clock_constraint(this,clock1,clock2,LE,peVar2);
  }
  else if (neg_bound.super_unary_expression_t._expr.
           super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi._4_4_ == VM_GE) {
    compile_clock_constraint(this,clock2,clock1,LE,(typed_expression_t *)local_60);
  }
  else if (neg_bound.super_unary_expression_t._expr.
           super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi._4_4_ == VM_GT) {
    compile_clock_constraint(this,clock2,clock1,LT,(typed_expression_t *)local_60);
  }
  else {
    if (neg_bound.super_unary_expression_t._expr.
        super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ != VM_EQ) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"invalid instruction");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    peVar2 = std::
             __shared_ptr_access<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)bound);
    compile_clock_constraint(this,clock1,clock2,LE,peVar2);
    compile_clock_constraint(this,clock2,clock1,LE,(typed_expression_t *)local_60);
    local_78[0] = 8;
    std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
              (&this->_bytecode_back_inserter,local_78);
  }
  typed_unary_expression_t::~typed_unary_expression_t((typed_unary_expression_t *)local_60);
  return;
}

Assistant:

void compile_clock_predicate(tchecker::typed_expression_t const & clock1, tchecker::typed_expression_t const & clock2,
                               std::shared_ptr<tchecker::typed_expression_t const> const & bound,
                               enum tchecker::instruction_t instruction)
  {
    // bound negation
    tchecker::typed_unary_expression_t neg_bound(tchecker::type_neg(bound->type()), tchecker::EXPR_OP_NEG, bound);

    // write bytecode
    if (instruction == tchecker::VM_LT)
      compile_clock_constraint(clock1, clock2, tchecker::LT, *bound);
    else if (instruction == tchecker::VM_LE)
      compile_clock_constraint(clock1, clock2, tchecker::LE, *bound);
    else if (instruction == tchecker::VM_GE)
      compile_clock_constraint(clock2, clock1, tchecker::LE, neg_bound);
    else if (instruction == tchecker::VM_GT)
      compile_clock_constraint(clock2, clock1, tchecker::LT, neg_bound);
    else if (instruction == tchecker::VM_EQ) {
      compile_clock_constraint(clock1, clock2, tchecker::LE, *bound);
      compile_clock_constraint(clock2, clock1, tchecker::LE, neg_bound);
      _bytecode_back_inserter = tchecker::VM_LAND;
    }
    else
      throw std::invalid_argument("invalid instruction");
  }